

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.hh
# Opt level: O2

void __thiscall kratos::SwitchStmt::~SwitchStmt(SwitchStmt *this)

{
  ~SwitchStmt(this);
  operator_delete(this,0x110);
  return;
}

Assistant:

explicit SwitchStmt(const std::shared_ptr<Var> &target) : SwitchStmt(*target) {}